

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

void ra_append_copy_range
               (roaring_array_t *ra,roaring_array_t *sa,int32_t start_index,int32_t end_index,
               _Bool copy_on_write)

{
  int iVar1;
  container_t *pcVar2;
  long lVar3;
  
  extend_array(ra,end_index - start_index);
  for (lVar3 = (long)start_index; lVar3 < end_index; lVar3 = lVar3 + 1) {
    iVar1 = ra->size;
    ra->keys[iVar1] = sa->keys[lVar3];
    if (copy_on_write) {
      pcVar2 = get_copy_of_container(sa->containers[lVar3],sa->typecodes + lVar3,true);
      sa->containers[lVar3] = pcVar2;
      pcVar2 = sa->containers[lVar3];
    }
    else {
      pcVar2 = container_clone(sa->containers[lVar3],sa->typecodes[lVar3]);
    }
    ra->containers[iVar1] = pcVar2;
    ra->typecodes[iVar1] = sa->typecodes[lVar3];
    ra->size = ra->size + 1;
  }
  return;
}

Assistant:

void ra_append_copy_range(roaring_array_t *ra, const roaring_array_t *sa,
                          int32_t start_index, int32_t end_index,
                          bool copy_on_write) {
    extend_array(ra, end_index - start_index);
    for (int32_t i = start_index; i < end_index; ++i) {
        const int32_t pos = ra->size;
        ra->keys[pos] = sa->keys[i];
        if (copy_on_write) {
            sa->containers[i] = get_copy_of_container(
                sa->containers[i], &sa->typecodes[i], copy_on_write);
            ra->containers[pos] = sa->containers[i];
            ra->typecodes[pos] = sa->typecodes[i];
        } else {
            ra->containers[pos] =
                container_clone(sa->containers[i], sa->typecodes[i]);
            ra->typecodes[pos] = sa->typecodes[i];
        }
        ra->size++;
    }
}